

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontengine_ft.cpp
# Opt level: O2

void __thiscall QFreetypeFace::cleanup(QFreetypeFace *this,EVP_PKEY_CTX *ctx)

{
  FT_Library pFVar1;
  
  QFontEngine::Holder::reset(&this->hbFace);
  if (this->mm_var != (FT_MM_Var *)0x0) {
    pFVar1 = qt_getFreetype();
    FT_Done_MM_Var(pFVar1,this->mm_var);
  }
  this->mm_var = (FT_MM_Var *)0x0;
  FT_Done_Face(this->face);
  this->face = (FT_Face_conflict)0x0;
  return;
}

Assistant:

void QFreetypeFace::cleanup()
{
    hbFace.reset();
    if (mm_var)
        FT_Done_MM_Var(qt_getFreetype(), mm_var);
    mm_var = nullptr;
    FT_Done_Face(face);
    face = nullptr;
}